

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_string(char *value)

{
  size_t sVar1;
  LOGGER_LOG p_Var2;
  undefined4 *puVar3;
  void *__dest;
  int iVar4;
  AMQP_VALUE pAVar5;
  char *pcVar6;
  
  if (value == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar6 = "NULL argument value";
    iVar4 = 0x42b;
    goto LAB_0015b712;
  }
  sVar1 = strlen(value);
  sVar1 = sVar1 + 1;
  if (sVar1 == 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
LAB_0015b6b9:
      pAVar5 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar5 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_string",0x437,1,"Invalid string size exceeded max allocation");
    }
  }
  else {
    puVar3 = (undefined4 *)malloc(0x20);
    if (puVar3 == (undefined4 *)0x0) goto LAB_0015b6b9;
    pAVar5 = (AMQP_VALUE)(puVar3 + 2);
    *puVar3 = 1;
  }
  if (pAVar5 == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar6 = "Could not allocate memory for AMQP value";
      iVar4 = 0x442;
LAB_0015b712:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_string",iVar4,1,pcVar6);
      return (AMQP_VALUE)0x0;
    }
  }
  else {
    pAVar5->type = AMQP_TYPE_STRING;
    __dest = malloc(sVar1);
    (pAVar5->value).binary_value.bytes = __dest;
    if (__dest != (void *)0x0) {
      memcpy(__dest,value,sVar1);
      return pAVar5;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_string",1099,1,"Could not allocate memory for string AMQP value")
      ;
    }
    free((void *)((long)&pAVar5[-1].value + 8));
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_string(const char* value)
{
    AMQP_VALUE result;
    if (value == NULL)
    {
        LogError("NULL argument value");
        result = NULL;
    }
    else
    {
        size_t length = strlen(value);
        size_t malloc_size = length + 1;

        // If the result of malloc_size is zero it means it had a type overflow (size_t is an unsigned type).
        // It is very unlikely but could happen.
        if (malloc_size == 0)
        {
            LogError("Invalid string size exceeded max allocation");
            result = NULL;
        }
        else
        {
            result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        }

        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_136: [If allocating the AMQP_VALUE fails then amqpvalue_create_string shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            result->type = AMQP_TYPE_STRING;
            result->value.string_value.chars = (char*)malloc(malloc_size);
            if (result->value.string_value.chars == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_136: [If allocating the AMQP_VALUE fails then amqpvalue_create_string shall return NULL.] */
                LogError("Could not allocate memory for string AMQP value");
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                (void)memcpy(result->value.string_value.chars, value, malloc_size);
            }
        }
    }

    return result;
}